

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O0

void __thiscall benchmark::State::SetLabel(State *this,char *label)

{
  string *this_00;
  char *in_RSI;
  MutexLock l;
  Mutex *in_stack_ffffffffffffffa8;
  MutexLock *in_stack_ffffffffffffffb0;
  CheckHandler *this_01;
  char *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  CheckHandler *in_stack_ffffffffffffffd0;
  CheckHandler local_18;
  char *local_10;
  
  if (((anonymous_namespace)::running_benchmark & 1) != 0) {
    local_10 = in_RSI;
    internal::GetNullLogInstance();
    GetBenchmarkLock();
    MutexLock::MutexLock(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    this_00 = (anonymous_namespace)::GetReportLabel_abi_cxx11_();
    std::__cxx11::string::operator=((string *)this_00,local_10);
    MutexLock::~MutexLock((MutexLock *)0x16822c);
    return;
  }
  this_01 = &local_18;
  internal::CheckHandler::CheckHandler
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             (char *)this_01,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  internal::CheckHandler::GetLog(this_01);
  internal::CheckHandler::~CheckHandler((CheckHandler *)&LAB_001681d4);
}

Assistant:

void State::SetLabel(const char* label) {
  CHECK(running_benchmark);
  MutexLock l(GetBenchmarkLock());
  *GetReportLabel() = label;
}